

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall
slang::CommandLine::parse
          (CommandLine *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          args,ParseOptions options)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view value;
  string_view value_00;
  string_view name;
  string_view name_00;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  iterator iVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *paVar5;
  size_type sVar6;
  const_reference pvVar7;
  size_type sVar8;
  pointer ppVar9;
  pointer ppVar10;
  uint in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  size_t in_RDX;
  pointer in_RSI;
  __shared_ptr *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> renamed;
  iterator it_1;
  iterator it;
  string lookupStr;
  size_t equalsIndex;
  size_t plusIndex;
  string_view remainder;
  string_view ignoreArg;
  string result;
  basic_string_view<char,_std::char_traits<char>_> arg;
  iterator __end1;
  iterator __begin1;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *__range1;
  int skip;
  string_view firstPositional;
  bool hadUnknowns;
  bool doubleDash;
  string expectingValName;
  Option *expectingVal;
  uint in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  char __c;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  iterator in_stack_fffffffffffffa88;
  iterator in_stack_fffffffffffffa90;
  path *in_stack_fffffffffffffa98;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  char *in_stack_fffffffffffffaa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffaa8;
  path *in_stack_fffffffffffffab0;
  undefined1 local_4d0 [32];
  char *local_4b0;
  undefined8 local_4a8;
  undefined1 local_4a0 [23];
  undefined1 in_stack_fffffffffffffb77;
  Option *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  uint in_stack_fffffffffffffb84;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb88;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  uint in_stack_fffffffffffffb9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_449 [2];
  _Self local_408;
  iterator in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  iterator in_stack_fffffffffffffc10;
  iterator in_stack_fffffffffffffc18;
  string_view in_stack_fffffffffffffc20;
  basic_string_view<char,_std::char_traits<char>_> local_368;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_358;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_350;
  size_t local_348;
  char *in_stack_fffffffffffffcc0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffcc8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffcd0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffcd8;
  undefined1 local_2d8 [32];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_2b8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_2b0;
  __sv_type local_2a8;
  undefined1 local_298 [32];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_278;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_270;
  basic_string_view<char,_std::char_traits<char>_> *local_268;
  int local_24c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_248;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_240;
  byte local_232;
  byte local_231;
  undefined1 local_230 [32];
  long local_210;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  local_208;
  uint local_18c;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  local_188;
  undefined1 local_178 [32];
  undefined8 local_158;
  undefined1 *local_150;
  char *local_148;
  undefined8 uStack_140;
  undefined1 *local_130;
  __shared_ptr *local_128;
  char *local_120;
  undefined8 uStack_118;
  undefined1 *local_110;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined8 uStack_d0;
  undefined1 *local_c0;
  __shared_ptr *local_b8;
  char *local_b0;
  undefined8 uStack_a8;
  undefined1 *local_a0;
  undefined1 local_98 [32];
  undefined8 local_78;
  undefined1 *local_70;
  char *local_68;
  undefined8 uStack_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *local_58;
  __shared_ptr *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_18c = in_ECX;
  local_188._M_ptr = in_RSI;
  local_188._M_extent._M_extent_value = in_RDX;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
                   *)0x2a94af);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"No options defined");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_18c & 0x100) == 0) {
    bVar1 = std::
            span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
            ::empty((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                     *)0x2a9537);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Expected at least one argument");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
    operator[](&local_188,0);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
               (format)((ulong)in_stack_fffffffffffffaa0 >> 0x38));
    std::filesystem::__cxx11::path::filename(in_stack_fffffffffffffa98);
    getU8Str((path *)0x2a95f6);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
    local_208 = std::
                span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                ::subspan(in_stack_fffffffffffffa70,(size_type)in_stack_fffffffffffffa68,
                          CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
    local_188._M_ptr = local_208._M_ptr;
    local_188._M_extent._M_extent_value = local_208._M_extent._M_extent_value;
  }
  local_210 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffffa80);
  local_231 = 0;
  local_232 = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_248);
  local_24c = 0;
  iVar4 = std::
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          ::begin((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                   *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  local_268 = (basic_string_view<char,_std::char_traits<char>_> *)
              std::
              span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
              ::end((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                     *)in_stack_fffffffffffffa68);
  bVar12._M_str = in_stack_fffffffffffffaa0;
  bVar12._M_len = (size_t)in_stack_fffffffffffffaa8;
  do {
    bVar1 = __gnu_cxx::
            operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                      ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                       (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_210 != 0) {
        in_stack_fffffffffffffa70 =
             (span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
              *)(in_RDI + 0xd8);
        local_4b0 = "{}: no value provided for argument \'{}\'";
        local_4a8 = 0x27;
        local_128 = in_RDI + 0xb8;
        local_110 = local_4a0;
        local_120 = "{}: no value provided for argument \'{}\'";
        uStack_118 = 0x27;
        local_130 = local_230;
        local_148 = "{}: no value provided for argument \'{}\'";
        uStack_140 = 0x27;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
        local_8 = &local_158;
        local_10 = local_178;
        local_158 = 0xdd;
        fmt_00.size_ = (size_t)in_stack_fffffffffffffcd8.values_;
        fmt_00.data_ = (char *)in_stack_fffffffffffffcd0.values_;
        args_01.field_1.values_ = in_stack_fffffffffffffcc8.values_;
        args_01.desc_ = (unsigned_long_long)in_stack_fffffffffffffcc0;
        local_150 = local_10;
        ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_01);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
      if (!bVar1) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_248);
        if ((!bVar1) && ((local_232 & 1) == 0)) {
          x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xd8);
          local_50 = in_RDI + 0xb8;
          local_38 = local_4d0;
          local_48 = "{}: positional arguments are not allowed (see e.g. \'{}\')";
          uStack_40 = 0x38;
          local_58 = &local_248;
          local_68 = "{}: positional arguments are not allowed (see e.g. \'{}\')";
          uStack_60 = 0x38;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffa70,x);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffa70,
                     (basic_string_view<char,_std::char_traits<char>_> *)x);
          local_28 = &local_78;
          local_30 = local_98;
          local_78 = 0xdd;
          fmt_01.size_ = (size_t)in_stack_fffffffffffffcd8.values_;
          fmt_01.data_ = (char *)in_stack_fffffffffffffcd0.values_;
          args_02.field_1.values_ = in_stack_fffffffffffffcc8.values_;
          args_02.desc_ = (unsigned_long_long)in_stack_fffffffffffffcc0;
          local_70 = local_30;
          ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_02);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffa70,x);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
        }
      }
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa70);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffa60));
      return (bool)(bVar2 & 1);
    }
    paVar5 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
             __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
             ::operator*((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                          *)&stack0xfffffffffffffda0);
    local_278 = *paVar5;
    aStack_270 = paVar5[1];
    if (local_24c == 0) {
      if (local_210 == 0) {
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_278);
        if ((sVar6 < 2) || ((local_231 & 1) != 0)) {
LAB_002a9a7f:
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_248);
          if (bVar1) {
            local_248 = local_278;
            local_240 = aStack_270;
          }
          bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
          if (bVar1) {
            std::
            __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a9ad5);
            sv((char *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
            in_stack_fffffffffffffa58 = local_18c >> 0x18 & 1;
            name_00._M_str._0_4_ = in_stack_fffffffffffffb98;
            name_00._M_len = (size_t)in_stack_fffffffffffffb90.values_;
            name_00._M_str._4_4_ = in_stack_fffffffffffffb9c;
            value_00._M_len._4_4_ = in_stack_fffffffffffffb84;
            value_00._M_len._0_4_ = in_stack_fffffffffffffb80;
            value_00._M_str = (char *)in_stack_fffffffffffffb88.values_;
            in_stack_fffffffffffffcd8 = local_278;
            Option::set_abi_cxx11_
                      (in_stack_fffffffffffffb78,name_00,value_00,(bool)in_stack_fffffffffffffb77);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
          }
        }
        else {
          pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&local_278,0);
          if (*pvVar7 != '-') {
            pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)&local_278,0);
            if (*pvVar7 != '+') goto LAB_002a9a7f;
          }
          in_stack_fffffffffffffcc8 = local_278;
          in_stack_fffffffffffffcd0 = aStack_270;
          bVar11 = sv((char *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                      CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          local_348 = bVar11._M_len;
          in_stack_fffffffffffffcc0 = bVar11._M_str;
          __x._M_str = (char *)in_stack_fffffffffffffa90._M_node;
          __x._M_len = (size_t)in_stack_fffffffffffffa88._M_node;
          bVar11._M_str = (char *)in_stack_fffffffffffffa80;
          bVar11._M_len = (size_t)in_stack_fffffffffffffa78;
          bVar1 = std::operator==(__x,bVar11);
          if (bVar1) {
            local_231 = 1;
          }
          else {
            bVar1 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)0x2a9bf0);
            if (bVar1) {
              bVar1 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)0x2a9c0a);
              if (!bVar1) goto LAB_002a9c12;
            }
            else {
LAB_002a9c12:
              local_358 = local_278;
              aStack_350 = aStack_270;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_368);
              pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&local_278,0);
              __c = (char)((uint)in_stack_fffffffffffffa5c >> 0x18);
              if (*pvVar7 == '+') {
                sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),__c
                                   ,0x2a9c73);
                bVar11 = local_368;
                if (sVar8 != 0xffffffffffffffff) {
                  _local_358 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                         ((basic_string_view<char,_std::char_traits<char>_> *)
                                          in_stack_fffffffffffffa80,
                                          (size_type)in_stack_fffffffffffffa78,
                                          (size_type)in_stack_fffffffffffffa70);
                  bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                     ((basic_string_view<char,_std::char_traits<char>_> *)
                                      in_stack_fffffffffffffa80,(size_type)in_stack_fffffffffffffa78
                                      ,(size_type)in_stack_fffffffffffffa70);
                }
              }
              else {
                sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),__c
                                   ,0x2a9d5c);
                bVar11 = local_368;
                if (sVar8 != 0xffffffffffffffff) {
                  _local_358 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                         ((basic_string_view<char,_std::char_traits<char>_> *)
                                          in_stack_fffffffffffffa80,
                                          (size_type)in_stack_fffffffffffffa78,
                                          (size_type)in_stack_fffffffffffffa70);
                  bVar12 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                     ((basic_string_view<char,_std::char_traits<char>_> *)
                                      in_stack_fffffffffffffa80,(size_type)in_stack_fffffffffffffa78
                                      ,(size_type)in_stack_fffffffffffffa70);
                  bVar11 = bVar12;
                }
              }
              __t = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffc27;
              local_368 = bVar11;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         bVar12._M_str,__t,(allocator<char> *)in_stack_fffffffffffffa90._M_node);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc27);
              in_stack_fffffffffffffa90 =
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                          (key_type *)0x2a9e7a);
              in_stack_fffffffffffffc18 = in_stack_fffffffffffffa90;
              in_stack_fffffffffffffc10 =
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
              bVar1 = std::operator==((_Self *)&stack0xfffffffffffffc18,
                                      (_Self *)&stack0xfffffffffffffc10);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                in_stack_fffffffffffffa88 =
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                            (key_type *)0x2a9f46);
                in_stack_fffffffffffffc00 = in_stack_fffffffffffffa88;
                local_408._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
                bVar1 = std::operator==((_Self *)&stack0xfffffffffffffc00,&local_408);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  in_stack_fffffffffffffc0c = 0;
                }
                else {
                  ppVar10 = std::
                            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)CONCAT17(in_stack_fffffffffffffa67,
                                                     in_stack_fffffffffffffa60));
                  in_stack_fffffffffffffa78 = &ppVar10->second;
                  in_stack_fffffffffffffa80 = local_449;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::
                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             bVar12._M_str,__t,(allocator<char> *)in_stack_fffffffffffffa90._M_node)
                  ;
                  std::operator+(in_stack_fffffffffffffa68,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
                  std::allocator<char>::~allocator((allocator<char> *)local_449);
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
                  in_stack_fffffffffffffa58 = local_18c;
                  in_stack_fffffffffffffb9c = local_18c;
                  handleArg((CommandLine *)in_stack_fffffffffffffc18._M_node,
                            in_stack_fffffffffffffc20,(Option **)in_stack_fffffffffffffc10._M_node,
                            (string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                            (bool *)in_stack_fffffffffffffc00._M_node,SUB84(iVar4._M_current,0));
                  in_stack_fffffffffffffc0c = 3;
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
                }
              }
              else {
                ppVar9 = std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                         ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                       *)CONCAT17(in_stack_fffffffffffffa67,
                                                  in_stack_fffffffffffffa60));
                local_24c = ppVar9->second;
                in_stack_fffffffffffffc0c = 3;
              }
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
              if (in_stack_fffffffffffffc0c != 0) goto LAB_002aa19f;
            }
            in_stack_fffffffffffffa58 = local_18c;
            in_stack_fffffffffffffb84 = local_18c;
            in_stack_fffffffffffffb88 = local_278;
            in_stack_fffffffffffffb90 = aStack_270;
            handleArg((CommandLine *)in_stack_fffffffffffffc18._M_node,in_stack_fffffffffffffc20,
                      (Option **)in_stack_fffffffffffffc10._M_node,
                      (string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                      (bool *)in_stack_fffffffffffffc00._M_node,SUB84(iVar4._M_current,0));
          }
        }
      }
      else {
        local_2a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
        local_2b8 = local_278;
        aStack_2b0 = aStack_270;
        in_stack_fffffffffffffa58 = local_18c >> 0x18 & 1;
        name._M_str._0_4_ = in_stack_fffffffffffffb98;
        name._M_len = (size_t)in_stack_fffffffffffffb90.values_;
        name._M_str._4_4_ = in_stack_fffffffffffffb9c;
        value._M_len._4_4_ = in_stack_fffffffffffffb84;
        value._M_len._0_4_ = in_stack_fffffffffffffb80;
        value._M_str = (char *)in_stack_fffffffffffffb88.values_;
        Option::set_abi_cxx11_(in_stack_fffffffffffffb78,name,value,(bool)in_stack_fffffffffffffb77)
        ;
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2a984b)
        ;
        if (!bVar1) {
          local_b8 = in_RDI + 0xb8;
          local_a0 = local_2d8;
          local_b0 = "{}: {}";
          uStack_a8 = 6;
          local_c0 = local_298;
          local_d8 = "{}: {}";
          uStack_d0 = 6;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68
                    );
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68
                    );
          local_18 = &local_e8;
          local_20 = local_108;
          local_e8 = 0xdd;
          fmt.size_ = (size_t)in_stack_fffffffffffffcd8.values_;
          fmt.data_ = (char *)in_stack_fffffffffffffcd0.values_;
          args_00.field_1.values_ = in_stack_fffffffffffffcc8.values_;
          args_00.desc_ = (unsigned_long_long)in_stack_fffffffffffffcc0;
          local_e0 = local_20;
          ::fmt::v11::vformat_abi_cxx11_(fmt,args_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
        }
        local_210 = 0;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
      }
    }
    else {
      local_24c = local_24c + -1;
    }
LAB_002aa19f:
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                  *)&stack0xfffffffffffffda0);
  } while( true );
}

Assistant:

bool CommandLine::parse(std::span<const std::string_view> args, ParseOptions options) {
    if (optionMap.empty())
        SLANG_THROW(std::runtime_error("No options defined"));

    if (!options.ignoreProgramName) {
        if (args.empty())
            SLANG_THROW(std::runtime_error("Expected at least one argument"));

        programName = getU8Str(fs::path(args[0]).filename());
        args = args.subspan(1);
    }

    Option* expectingVal = nullptr;
    std::string expectingValName;
    bool doubleDash = false;
    bool hadUnknowns = false;
    std::string_view firstPositional;

    int skip = 0;
    for (auto arg : args) {
        // Skip N arguments if needed (set by the cmdIgnore feature).
        if (skip) {
            skip--;
            continue;
        }

        // If we were previously expecting a value, set that now.
        if (expectingVal) {
            std::string result = expectingVal->set(expectingValName, arg, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));

            expectingVal = nullptr;
            continue;
        }

        // This is a positional argument if:
        // - Doesn't start with '-' and '+'
        // - Is exactly '-'
        // - Or we've seen a double dash already
        if (arg.length() <= 1 || doubleDash || (arg[0] != '-' && arg[0] != '+')) {
            if (firstPositional.empty())
                firstPositional = arg;

            if (positional)
                positional->set(""sv, arg, options.ignoreDuplicates);

            continue;
        }

        // Double dash indicates that all further arguments are positional.
        if (arg == "--"sv) {
            doubleDash = true;
            continue;
        }

        // Check if arg is in the list of commands to skip or translate.
        if (!cmdIgnore.empty() || !cmdRename.empty()) {
            std::string_view ignoreArg = arg;
            std::string_view remainder;
            if (arg[0] == '+') {
                // If we ignore a vendor command of the form +xx ,
                // we match on any +xx+yyy command as +yy is the command's argument.
                size_t plusIndex = arg.find_first_of('+', 1);
                if (plusIndex != std::string_view::npos) {
                    ignoreArg = arg.substr(0, plusIndex);
                    remainder = arg.substr(plusIndex);
                }
            }
            else {
                // Otherwise we look up to the first equals for the name to ignore.
                size_t equalsIndex = arg.find_first_of('=');
                if (equalsIndex != std::string_view::npos) {
                    ignoreArg = arg.substr(0, equalsIndex);
                    remainder = arg.substr(equalsIndex);
                }
            }

            auto lookupStr = std::string(ignoreArg);
            if (auto it = cmdIgnore.find(lookupStr); it != cmdIgnore.end()) {
                // If yes, find how many args to skip.
                skip = it->second;
                continue;
            }

            if (auto it = cmdRename.find(lookupStr); it != cmdRename.end()) {
                // If yes, rename argument.
                auto renamed = it->second + std::string(remainder);
                handleArg(renamed, expectingVal, expectingValName, hadUnknowns, options);
                continue;
            }
        }

        // Otherwise just handle the argument.
        handleArg(arg, expectingVal, expectingValName, hadUnknowns, options);
    }

    if (expectingVal) {
        errors.emplace_back(fmt::format("{}: no value provided for argument '{}'"sv, programName,
                                        expectingValName));
    }

    if (!positional && !firstPositional.empty() && !hadUnknowns) {
        errors.emplace_back(
            fmt::format("{}: positional arguments are not allowed (see e.g. '{}')"sv, programName,
                        firstPositional));
    }

    return errors.empty();
}